

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclConstructorSizing1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclConstructorSizing1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  pointer ppVar2;
  TestError *pTVar3;
  string *local_5a8;
  undefined1 *local_468;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [8];
  string variable_constructor;
  string shader_source;
  size_t valid_size_initializers_index;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_248;
  iterator local_240;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_238;
  _supported_variable_types_map_const_iterator var_iterator;
  size_t var_type_index;
  allocator<char> local_220;
  allocator<char> local_21f;
  allocator<char> local_21e;
  allocator<char> local_21d;
  allocator<char> local_21c;
  allocator<char> local_21b;
  allocator<char> local_21a;
  allocator<char> local_219;
  allocator<char> local_218;
  allocator<char> local_217;
  allocator<char> local_216;
  allocator<char> local_215 [20];
  allocator<char> local_201;
  string *local_200;
  string local_1f8 [8];
  string valid_size_initializers [15];
  TestShaderType tested_shader_type_local;
  ConstructorsAndUnsizedDeclConstructorSizing1<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  var_type_index._5_1_ = 1;
  local_200 = local_1f8;
  valid_size_initializers[0xe].field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"[1][1][1][]",&local_201);
  local_200 = (string *)(valid_size_initializers[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[0].field_2._M_local_buf + 8),"[1][1][][1]",local_215
            );
  local_200 = (string *)(valid_size_initializers[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[1].field_2._M_local_buf + 8),"[1][][1][1]",
             &local_216);
  local_200 = (string *)(valid_size_initializers[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[2].field_2._M_local_buf + 8),"[][1][1][1]",
             &local_217);
  local_200 = (string *)(valid_size_initializers[3].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[3].field_2._M_local_buf + 8),"[1][1][][]",&local_218
            );
  local_200 = (string *)(valid_size_initializers[4].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[4].field_2._M_local_buf + 8),"[1][][1][]",&local_219
            );
  local_200 = (string *)(valid_size_initializers[5].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[5].field_2._M_local_buf + 8),"[][1][1][]",&local_21a
            );
  local_200 = (string *)(valid_size_initializers[6].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[6].field_2._M_local_buf + 8),"[1][][][1]",&local_21b
            );
  local_200 = (string *)(valid_size_initializers[7].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[7].field_2._M_local_buf + 8),"[][1][][1]",&local_21c
            );
  local_200 = (string *)(valid_size_initializers[8].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[8].field_2._M_local_buf + 8),"[][][1][1]",&local_21d
            );
  local_200 = (string *)(valid_size_initializers[9].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[9].field_2._M_local_buf + 8),"[1][][][]",&local_21e)
  ;
  local_200 = (string *)(valid_size_initializers[10].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[10].field_2._M_local_buf + 8),"[][1][][]",&local_21f
            );
  local_200 = (string *)(valid_size_initializers[0xb].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[0xb].field_2._M_local_buf + 8),"[][][1][]",
             &local_220);
  local_200 = (string *)(valid_size_initializers[0xc].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[0xc].field_2._M_local_buf + 8),"[][][][1]",
             (allocator<char> *)((long)&var_type_index + 7));
  local_200 = (string *)(valid_size_initializers[0xd].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(valid_size_initializers[0xd].field_2._M_local_buf + 8),"[][][][]",
             (allocator<char> *)((long)&var_type_index + 6));
  var_type_index._5_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&var_type_index + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&var_type_index + 7));
  std::allocator<char>::~allocator(&local_220);
  std::allocator<char>::~allocator(&local_21f);
  std::allocator<char>::~allocator(&local_21e);
  std::allocator<char>::~allocator(&local_21d);
  std::allocator<char>::~allocator(&local_21c);
  std::allocator<char>::~allocator(&local_21b);
  std::allocator<char>::~allocator(&local_21a);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::~allocator(&local_218);
  std::allocator<char>::~allocator(&local_217);
  std::allocator<char>::~allocator(&local_216);
  std::allocator<char>::~allocator(local_215);
  std::allocator<char>::~allocator(&local_201);
  var_iterator._M_node = (_Base_ptr)0x0;
  while( true ) {
    if ((_Base_ptr)0x28 < var_iterator._M_node) {
      local_5a8 = (string *)(valid_size_initializers[0xe].field_2._M_local_buf + 8);
      do {
        local_5a8 = local_5a8 + -0x20;
        std::__cxx11::string::~string(local_5a8);
      } while (local_5a8 != local_1f8);
      return;
    }
    local_240._M_node =
         (_Base_ptr)
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 *)supported_variable_types_map,
                (key_type *)(Interface::GL::var_types + (long)var_iterator._M_node * 4));
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_238,&local_240);
    valid_size_initializers_index =
         (size_t)std::
                 map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                        *)supported_variable_types_map);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_248,(iterator *)&valid_size_initializers_index);
    bVar1 = std::operator!=(&local_238,&local_248);
    if (!bVar1) break;
    for (shader_source.field_2._8_8_ = 0; (ulong)shader_source.field_2._8_8_ < 0xf;
        shader_source.field_2._8_8_ = shader_source.field_2._8_8_ + 1) {
      std::__cxx11::string::string((string *)(variable_constructor.field_2._M_local_buf + 8));
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_238);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,"    "
                     ,&(ppVar2->second).type);
      std::operator+(&local_418,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs," x");
      std::operator+(&local_3f8,&local_418,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&valid_size_initializers[shader_source.field_2._8_8_ + -1].field_2 + 8))
      ;
      std::operator+(&local_3d8,&local_3f8," = ");
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_238);
      std::operator+(&local_3b8,&local_3d8,&(ppVar2->second).type);
      std::operator+(&local_398,&local_3b8,"[1][1][1][1](");
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_238);
      std::operator+(&local_378,&local_398,&(ppVar2->second).type);
      std::operator+(&local_358,&local_378,"[1][1][1](");
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_238);
      std::operator+(&local_338,&local_358,&(ppVar2->second).type);
      std::operator+(&local_318,&local_338,"[1][1](");
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_238);
      std::operator+(&local_2f8,&local_318,&(ppVar2->second).type);
      std::operator+(&local_2d8,&local_2f8,"[1](");
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_238);
      std::operator+(&local_2b8,&local_2d8,&(ppVar2->second).initializer_with_zeroes);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                     &local_2b8,"))));\n");
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&cs);
      std::__cxx11::string::operator=
                ((string *)(variable_constructor.field_2._M_local_buf + 8),
                 (string *)shader_start_abi_cxx11_);
      std::__cxx11::string::operator+=
                ((string *)(variable_constructor.field_2._M_local_buf + 8),(string *)local_298);
      switch(valid_size_initializers[0xe].field_2._12_4_) {
      case 0:
        break;
      case 1:
        std::__cxx11::string::operator+=
                  ((string *)(variable_constructor.field_2._M_local_buf + 8),
                   "\n\tgl_Position = vec4(0.0);\n");
        break;
      case 2:
        break;
      case 3:
        std::__cxx11::string::operator+=
                  ((string *)(variable_constructor.field_2._M_local_buf + 8),
                   (string *)emit_quad_abi_cxx11_);
        break;
      case 4:
        std::__cxx11::string::operator+=
                  ((string *)(variable_constructor.field_2._M_local_buf + 8),
                   (string *)set_tesseation_abi_cxx11_);
        break;
      case 5:
        break;
      default:
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x923);
        __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::string::operator+=
                ((string *)(variable_constructor.field_2._M_local_buf + 8),
                 (string *)shader_end_abi_cxx11_);
      vs = (string *)empty_string_abi_cxx11_;
      tcs = (string *)default_vertex_shader_source_abi_cxx11_;
      tes = (string *)default_tc_shader_source_abi_cxx11_;
      gs = (string *)default_te_shader_source_abi_cxx11_;
      fs = (string *)default_geometry_shader_source_abi_cxx11_;
      local_468 = default_fragment_shader_source_abi_cxx11_;
      switch(valid_size_initializers[0xe].field_2._12_4_) {
      case 0:
        local_468 = (undefined1 *)((long)&variable_constructor.field_2 + 8);
        break;
      case 1:
        tcs = (string *)((long)&variable_constructor.field_2 + 8);
        break;
      case 2:
        vs = (string *)((long)&variable_constructor.field_2 + 8);
        tcs = (string *)empty_string_abi_cxx11_;
        tes = (string *)empty_string_abi_cxx11_;
        gs = (string *)empty_string_abi_cxx11_;
        fs = (string *)empty_string_abi_cxx11_;
        local_468 = empty_string_abi_cxx11_;
        break;
      case 3:
        fs = (string *)((long)&variable_constructor.field_2 + 8);
        break;
      case 4:
        tes = (string *)((long)&variable_constructor.field_2 + 8);
        break;
      case 5:
        gs = (string *)((long)&variable_constructor.field_2 + 8);
        break;
      default:
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x926);
        __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
        super_TestNode._vptr_TestNode[10])(this,tcs,tes,gs,fs,local_468,vs,1,0);
      std::__cxx11::string::~string((string *)local_298);
      std::__cxx11::string::~string((string *)(variable_constructor.field_2._M_local_buf + 8));
    }
    var_iterator._M_node = (_Base_ptr)((long)&(var_iterator._M_node)->_M_color + 1);
  }
  pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar3,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x92b);
  __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ConstructorsAndUnsizedDeclConstructorSizing1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string valid_size_initializers[] = { "[1][1][1][]", "[1][1][][1]", "[1][][1][1]", "[][1][1][1]", "[1][1][][]",
											  "[1][][1][]",  "[][1][1][]",  "[1][][][1]",  "[][1][][1]",  "[][][1][1]",
											  "[1][][][]",   "[][1][][]",   "[][][1][]",   "[][][][1]",   "[][][][]" };

	for (size_t var_type_index = 0; var_type_index < API::n_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t valid_size_initializers_index = 0;
				 valid_size_initializers_index < sizeof(valid_size_initializers) / sizeof(valid_size_initializers[0]);
				 valid_size_initializers_index++)
			{
				std::string shader_source;
				std::string variable_constructor =
					"    " + var_iterator->second.type + " x" + valid_size_initializers[valid_size_initializers_index] +
					" = " + var_iterator->second.type + "[1][1][1][1](" + var_iterator->second.type + "[1][1][1](" +
					var_iterator->second.type + "[1][1](" + var_iterator->second.type + "[1](" +
					var_iterator->second.initializer_with_zeroes + "))));\n";

				shader_source = shader_start;
				shader_source += variable_constructor;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
			} /* for (int valid_size_initializers_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}